

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryVkImpl.cpp
# Opt level: O0

bool __thiscall Diligent::QueryVkImpl::OnEndQuery(QueryVkImpl *this,DeviceContextVkImpl *pContext)

{
  undefined *puVar1;
  bool bVar2;
  SoftwareQueueIndex CommandQueueInd;
  reference pvVar3;
  undefined8 uVar4;
  Char *Message;
  Uint64 UVar5;
  char (*in_RCX) [23];
  char (*in_R8) [45];
  undefined1 local_70 [7];
  SoftwareQueueIndex CmdQueueId;
  string msg;
  undefined1 local_40 [8];
  string _msg;
  DeviceContextVkImpl *pContext_local;
  QueryVkImpl *this_local;
  
  _msg.field_2._8_8_ = pContext;
  QueryBase<Diligent::EngineVkImplTraits>::OnEndQuery
            (&this->super_QueryBase<Diligent::EngineVkImplTraits>,pContext);
  if (((this->super_QueryBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
       .m_Desc.Type != QUERY_TYPE_TIMESTAMP) || (bVar2 = AllocateQueries(this), bVar2)) {
    pvVar3 = std::array<unsigned_int,_2UL>::operator[]
                       ((array<unsigned_int,_2UL> *)
                        &(this->super_QueryBase<Diligent::EngineVkImplTraits>).field_0x44,0);
    if ((*pvVar3 == 0xffffffff) ||
       (((this->super_QueryBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
         .m_Desc.Type == QUERY_TYPE_DURATION &&
        (pvVar3 = std::array<unsigned_int,_2UL>::operator[]
                            ((array<unsigned_int,_2UL> *)
                             &(this->super_QueryBase<Diligent::EngineVkImplTraits>).field_0x44,1),
        *pvVar3 == 0xffffffff)))) {
      FormatString<char[8],char_const*,char[45]>
                ((string *)local_40,(Diligent *)"Query \'",
                 (char (*) [8])
                 &(this->super_QueryBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                  .m_Desc,(char **)"\' is invalid: Vulkan query allocation failed",in_R8);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_40);
      this_local._7_1_ = false;
    }
    else {
      if (this->m_pQueryMgr == (QueryManagerVk *)0x0) {
        FormatString<char[26],char[23]>
                  ((string *)local_70,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_pQueryMgr != nullptr",in_RCX);
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"OnEndQuery",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
                   ,0x81);
        std::__cxx11::string::~string((string *)local_70);
      }
      CommandQueueInd = QueryManagerVk::GetCommandQueueId(this->m_pQueryMgr);
      UVar5 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ::GetNextFenceValue(&((this->super_QueryBase<Diligent::EngineVkImplTraits>).
                                    super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                                   .m_pDevice)->
                                   super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                                  ,CommandQueueInd);
      this->m_QueryEndFenceValue = UVar5;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool QueryVkImpl::OnEndQuery(DeviceContextVkImpl* pContext)
{
    TQueryBase::OnEndQuery(pContext);

    if (m_Desc.Type == QUERY_TYPE_TIMESTAMP)
    {
        if (!AllocateQueries())
            return false;
    }

    if (m_QueryPoolIndex[0] == QueryManagerVk::InvalidIndex || (m_Desc.Type == QUERY_TYPE_DURATION && m_QueryPoolIndex[1] == QueryManagerVk::InvalidIndex))
    {
        LOG_ERROR_MESSAGE("Query '", m_Desc.Name, "' is invalid: Vulkan query allocation failed");
        return false;
    }

    VERIFY_EXPR(m_pQueryMgr != nullptr);
    auto CmdQueueId      = m_pQueryMgr->GetCommandQueueId();
    m_QueryEndFenceValue = m_pDevice->GetNextFenceValue(CmdQueueId);

    return true;
}